

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O2

void setMPIRequest(IceTCommRequest icet_request,MPI_Request mpi_request)

{
  char *msg;
  int iStack_8;
  
  if (icet_request == (IceTCommRequest)0x0) {
    msg = "Cannot set MPI request in null request.";
    iStack_8 = 0x6e;
  }
  else {
    if (icet_request->magic_number == 0xd7168b00) {
      *(MPI_Request *)icet_request->internals = mpi_request;
      return;
    }
    msg = "Request object is not from the MPI communicator.";
    iStack_8 = 0x74;
  }
  icetRaiseDiagnostic(msg,0xffffffff,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                      ,iStack_8);
  return;
}

Assistant:

static void setMPIRequest(IceTCommRequest icet_request, MPI_Request mpi_request)
{
    if (icet_request == ICET_COMM_REQUEST_NULL) {
        icetRaiseError("Cannot set MPI request in null request.",
                       ICET_SANITY_CHECK_FAIL);
        return;
    }

    if (icet_request->magic_number != ICET_MPI_REQUEST_MAGIC_NUMBER) {
        icetRaiseError("Request object is not from the MPI communicator.",
                       ICET_SANITY_CHECK_FAIL);
        return;
    }

    (((IceTMPICommRequestInternals)icet_request->internals)->request)
        = mpi_request;
}